

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPClient.cpp
# Opt level: O0

ssize_t __thiscall
tiger::trains::network::TCPClient::send(TCPClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  int lastSent;
  size_t sent;
  void *local_38;
  int local_24;
  void *local_20;
  
  local_24 = 0;
  for (local_20 = (void *)0x0; local_20 < __buf;
      local_20 = (void *)((long)local_24 + (long)local_20)) {
    sVar1 = TCPSocket::send(&this->tcpSocket,__fd + (int)local_20,
                            (void *)((long)__buf - (long)local_20),__n,__flags);
    local_24 = (int)sVar1;
    if (local_24 == -1) break;
  }
  if (local_24 == -1) {
    local_38 = (void *)0xffffffffffffffff;
  }
  else {
    local_38 = local_20;
  }
  return (ssize_t)local_38;
}

Assistant:

int TCPClient::send(const char *buffer, size_t bufferSize)
{
    size_t sent = 0;
    int lastSent = 0;

    while (sent < bufferSize)
    {
        lastSent = tcpSocket.send(buffer + sent, bufferSize - sent);

        if (lastSent == -1) break;

        sent += lastSent;
    }

    return lastSent == -1 ? -1 : sent;
}